

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_hc.cpp
# Opt level: O2

vec2F __thiscall
crnlib::dxt_hc::palettize_alpha
          (dxt_hc *this,color_quad_u8 *pixels,uint pixels_count,uint comp_index)

{
  vec2F vVar1;
  float fVar2;
  uint i;
  ulong uVar3;
  uint size;
  undefined4 in_register_00000014;
  byte bVar4;
  uint in_R8D;
  ulong uVar5;
  float extraout_XMM0_Da;
  float extraout_XMM0_Db;
  vec1F result [2];
  uint8 alpha [64];
  uint weights [64];
  vec1F vectors [64];
  vec<2U,_float> local_270;
  byte local_268 [64];
  uint local_228 [64];
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_128 [66];
  
  uVar5 = (ulong)comp_index;
  for (uVar3 = 0; uVar5 != uVar3; uVar3 = uVar3 + 1) {
    local_268[uVar3] =
         *(byte *)((ulong)in_R8D + CONCAT44(in_register_00000014,pixels_count) + uVar3 * 4);
  }
  std::__sort<unsigned_char*,__gnu_cxx::__ops::_Iter_less_iter>(local_268,local_268 + uVar5);
  size = 0;
  for (uVar3 = 0; uVar5 != uVar3; uVar3 = uVar3 + 1) {
    bVar4 = local_268[0];
    if ((uVar3 == 0) || (bVar4 = local_268[uVar3], bVar4 != local_268[uVar3 - 1])) {
      local_128[size] = pixels[(ulong)bVar4 + 0x8d].field_0;
      local_228[size] = 1;
      size = size + 1;
    }
    else {
      local_228[size - 1] = local_228[size - 1] + 1;
    }
  }
  split_vectors<crnlib::vec<1u,float>>
            ((vec<1U,_float> (*) [64])local_128,&local_228,size,(vec<1U,_float> (*) [2])&local_270);
  fVar2 = local_270.m_s[0];
  if (local_270.m_s[1] < local_270.m_s[0]) {
    local_270.m_s[0] = local_270.m_s[1];
    local_270.m_s[1] = fVar2;
  }
  vec<2U,_float>::vec((vec<2U,_float> *)this,&local_270);
  vVar1.m_s[1] = extraout_XMM0_Db;
  vVar1.m_s[0] = extraout_XMM0_Da;
  return (vec2F)vVar1.m_s;
}

Assistant:

vec2F dxt_hc::palettize_alpha(color_quad_u8* pixels, uint pixels_count, uint comp_index)
    {
        uint8 alpha[64];
        for (uint p = 0; p < pixels_count; p++)
        {
            alpha[p] = pixels[p][comp_index];
        }
        std::sort(alpha, alpha + pixels_count);
        vec1F vectors[64];
        uint weights[64];
        uint size = 0;
        for (uint i = 0; i < pixels_count; i++)
        {
            if (!i || alpha[i] != alpha[i - 1])
            {
                vectors[size][0] = m_uint8_to_float[alpha[i]];
                weights[size] = 1;
                size++;
            }
            else
            {
                weights[size - 1]++;
            }
        }
        vec1F result[2];
        split_vectors<vec1F>(vectors, weights, size, result);
        if (result[0] > result[1])
        {
            std::swap(result[0], result[1]);
        }
        return *(vec2F*)result;
    }